

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

int timeOffsetUTC(void)

{
  time_t rawtime;
  tm gbuf;
  
  return timeOffsetUTC::cachedOffset;
}

Assistant:

int timeOffsetUTC()
{
    static int cachedOffset = INT_MIN;

    if (cachedOffset > INT_MIN)
        return cachedOffset;
    else {
        time_t gmt, rawtime = time(NULL);
        struct tm gbuf;
        gmtime_s(&gbuf, &rawtime);

        // Request that mktime() looks up dst in timezone database
        gbuf.tm_isdst = -1;
        gmt = mktime(&gbuf);

        return cachedOffset = (int)difftime(rawtime, gmt);
    }
}